

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
AppendSize<google::protobuf::internal::EpsCopyInputStream::SkipFallback(char_const*,int)::__0>
          (EpsCopyInputStream *this,char *ptr,int size,anon_class_1_0_00000001 *append)

{
  LogMessage *pLVar1;
  LogMessage local_50;
  Voidify local_39;
  int local_38;
  undefined1 local_31;
  int chunk_size;
  bool kCheckReturn;
  anon_class_1_0_00000001 *append_local;
  char *pcStack_20;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_31 = 0;
  _chunk_size = append;
  append_local._4_4_ = size;
  pcStack_20 = ptr;
  ptr_local = (char *)this;
  local_38 = BytesAvailable(this,ptr);
  while( true ) {
    if (append_local._4_4_ <= local_38) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,0x1ab,"size > chunk_size");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    SkipFallback::anon_class_1_0_00000001::operator()(_chunk_size,pcStack_20,local_38);
    pcStack_20 = pcStack_20 + local_38;
    append_local._4_4_ = append_local._4_4_ - local_38;
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcStack_20 = Next(this);
    if (pcStack_20 == (char *)0x0) break;
    pcStack_20 = pcStack_20 + 0x10;
    local_38 = BytesAvailable(this,pcStack_20);
    if (append_local._4_4_ <= local_38) {
      SkipFallback::anon_class_1_0_00000001::operator()(_chunk_size,pcStack_20,append_local._4_4_);
      return pcStack_20 + append_local._4_4_;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* AppendSize(const char* ptr, int size, const A& append) {
    // Some append functions may return false to bail out early.
    constexpr bool kCheckReturn =
        std::is_invocable_r_v<bool, decltype(append), const char*, int>;

    int chunk_size = BytesAvailable(ptr);
    do {
      ABSL_DCHECK(size > chunk_size);
      if (next_chunk_ == nullptr) return nullptr;
      if constexpr (kCheckReturn) {
        if (!append(ptr, chunk_size)) return nullptr;
      } else {
        append(ptr, chunk_size);
      }
      ptr += chunk_size;
      size -= chunk_size;
      // TODO Next calls NextBuffer which generates buffers with
      // overlap and thus incurs cost of copying the slop regions. This is not
      // necessary for reading strings. We should just call Next buffers.
      if (limit_ <= kSlopBytes) return nullptr;
      ptr = Next();
      if (ptr == nullptr) return nullptr;  // passed the limit
      ptr += kSlopBytes;
      chunk_size = BytesAvailable(ptr);
    } while (size > chunk_size);

    if constexpr (kCheckReturn) {
      if (!append(ptr, size)) return nullptr;
    } else {
      append(ptr, size);
    }
    return ptr + size;
  }